

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void prefix_identifier(ch_compilation *comp)

{
  ch_token_kind cVar1;
  _Bool _Var2;
  ch_op op;
  ch_token identifier;
  undefined4 local_34;
  ch_token local_30;
  
  cVar1 = (comp->previous).kind;
  _Var2 = consume(comp,TK_ID,"Expected identifier",&local_30);
  if (_Var2) {
    load_variable(comp,local_30.lexeme);
    if (cVar1 == TK_PLUS_PLUS) {
      local_34 = 7;
    }
    else {
      local_34 = 9;
    }
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_34,1);
    local_34 = 3;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_34,1);
    set_variable(comp,local_30.lexeme);
  }
  return;
}

Assistant:

void prefix_identifier(ch_compilation *comp) {
  ch_token token = comp->previous;
  ch_token identifier;
  if (!consume(comp, TK_ID, "Expected identifier", &identifier)) return;

  load_variable(comp, identifier.lexeme);

  if (token.kind == TK_PLUS_PLUS) {
    EMIT_OP(GET_EMIT(comp), OP_ADDONE);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_SUBONE);
  }

  // Duplicate its value so that the new value stays on the stack
  EMIT_OP(GET_EMIT(comp), OP_TOP);
  set_variable(comp, identifier.lexeme);
  return;
}